

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,logic_t bit)

{
  (this->numFlags).raw = '\0';
  this->rawLen = 0;
  this->info = (Info *)0x0;
  init(this,(EVP_PKEY_CTX *)alloc);
  *(uint8_t *)&this->info[1].rawTextPtr = bit.value;
  return;
}

Assistant:

Token::Token(BumpAllocator& alloc, TokenKind kind, std::span<Trivia const> trivia,
             std::string_view rawText, SourceLocation location, logic_t bit) {
    SLANG_ASSERT(kind == TokenKind::UnbasedUnsizedLiteral);
    init(alloc, kind, trivia, rawText, location);
    info->bit() = bit;
}